

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O0

void dumpPubSection(DWARFContext *DCtx,PubSection *Y,DWARFSection Section)

{
  size_t sVar1;
  bool IsLittleEndian;
  uint16_t uVar2;
  uint32_t uVar3;
  DWARFObject *Obj;
  uint64_t uVar4;
  char *Str;
  StringRef local_88;
  uint8_t local_75;
  uint32_t local_74;
  undefined1 local_70 [8];
  PubEntry NewEntry;
  uint64_t Offset;
  DWARFDataExtractor PubSectionData;
  PubSection *Y_local;
  DWARFContext *DCtx_local;
  DWARFSection Section_local;
  
  Section_local.Data.Data = (char *)Section.Data.Length;
  DCtx_local = (DWARFContext *)Section.Data.Data;
  PubSectionData.Section = (DWARFSection *)Y;
  Obj = llvm::DWARFContext::getDWARFObj(DCtx);
  IsLittleEndian = llvm::DWARFContext::isLittleEndian(DCtx);
  llvm::DWARFDataExtractor::DWARFDataExtractor
            ((DWARFDataExtractor *)&Offset,Obj,(DWARFSection *)&DCtx_local,IsLittleEndian,'\0');
  NewEntry.Name.Length = 0;
  dumpInitialLength((DataExtractor *)&Offset,&NewEntry.Name.Length,
                    (InitialLength *)PubSectionData.Section);
  uVar2 = llvm::DataExtractor::getU16((DataExtractor *)&Offset,&NewEntry.Name.Length,(Error *)0x0);
  *(uint16_t *)&PubSectionData.Section[1].Data.Data = uVar2;
  uVar3 = llvm::DataExtractor::getU32((DataExtractor *)&Offset,&NewEntry.Name.Length,(Error *)0x0);
  *(uint32_t *)((long)&PubSectionData.Section[1].Data.Data + 4) = uVar3;
  uVar3 = llvm::DataExtractor::getU32((DataExtractor *)&Offset,&NewEntry.Name.Length,(Error *)0x0);
  *(uint32_t *)&PubSectionData.Section[1].Data.Length = uVar3;
  while( true ) {
    sVar1 = NewEntry.Name.Length;
    uVar4 = llvm::DWARFYAML::InitialLength::getLength((InitialLength *)PubSectionData.Section);
    if (uVar4 <= sVar1) break;
    llvm::DWARFYAML::PubEntry::PubEntry((PubEntry *)local_70);
    local_74 = llvm::DataExtractor::getU32
                         ((DataExtractor *)&Offset,&NewEntry.Name.Length,(Error *)0x0);
    llvm::yaml::Hex32::operator=((Hex32 *)local_70,&local_74);
    if ((PubSectionData.Section[1].Data.Length & 0x100000000) != 0) {
      local_75 = llvm::DataExtractor::getU8
                           ((DataExtractor *)&Offset,&NewEntry.Name.Length,(Error *)0x0);
      llvm::yaml::Hex8::operator=((Hex8 *)(local_70 + 4),&local_75);
    }
    Str = llvm::DataExtractor::getCStr((DataExtractor *)&Offset,&NewEntry.Name.Length);
    llvm::StringRef::StringRef(&local_88,Str);
    NewEntry._0_8_ = local_88.Data;
    NewEntry.Name.Data = (char *)local_88.Length;
    std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>::push_back
              ((vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *)
               (PubSectionData.Section + 2),(value_type *)local_70);
  }
  return;
}

Assistant:

void dumpPubSection(DWARFContext &DCtx, DWARFYAML::PubSection &Y,
                    DWARFSection Section) {
  DWARFDataExtractor PubSectionData(DCtx.getDWARFObj(), Section,
                                    DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  dumpInitialLength(PubSectionData, Offset, Y.Length);
  Y.Version = PubSectionData.getU16(&Offset);
  Y.UnitOffset = PubSectionData.getU32(&Offset);
  Y.UnitSize = PubSectionData.getU32(&Offset);
  while (Offset < Y.Length.getLength()) {
    DWARFYAML::PubEntry NewEntry;
    NewEntry.DieOffset = PubSectionData.getU32(&Offset);
    if (Y.IsGNUStyle)
      NewEntry.Descriptor = PubSectionData.getU8(&Offset);
    NewEntry.Name = PubSectionData.getCStr(&Offset);
    Y.Entries.push_back(NewEntry);
  }
}